

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binarymodelserialiser.cpp
# Opt level: O0

bool __thiscall
BinaryModelSerialiser::saveModel(BinaryModelSerialiser *this,QByteArray *destination)

{
  BinaryModelSerialiserPrivate *this_00;
  QFlags<QIODeviceBase::OpenModeFlag> local_4c;
  QDataStream local_48 [8];
  QDataStream witer;
  BinaryModelSerialiserPrivate *d;
  QByteArray *destination_local;
  BinaryModelSerialiser *this_local;
  
  if (destination == (QByteArray *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    this_00 = d_func(this);
    if ((this_00->super_AbstractModelSerialiserPrivate).m_constModel == (QAbstractItemModel *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      QFlags<QIODeviceBase::OpenModeFlag>::QFlags(&local_4c,WriteOnly);
      QDataStream::QDataStream
                (local_48,(QByteArray *)destination,(QFlags_conflict1 *)(ulong)local_4c.i);
      QDataStream::setVersion
                (local_48,(this_00->super_AbstractModelSerialiserPrivate).m_streamVersion);
      this_local._7_1_ = BinaryModelSerialiserPrivate::writeBinary(this_00,local_48);
      QDataStream::~QDataStream(local_48);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool BinaryModelSerialiser::saveModel(QByteArray *destination) const
{
    if (!destination)
        return false;
    Q_D(const BinaryModelSerialiser);

    if (!d->m_constModel)
        return false;
    QDataStream witer(destination, QIODevice::WriteOnly);
    witer.setVersion(d->m_streamVersion);
    return d->writeBinary(witer);
}